

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O1

Vec_Wec_t * Seg_ManCollectObjEdges(Vec_Int_t *vEdges,int nObjs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int Entry;
  
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < nObjs - 1U) {
    iVar6 = nObjs;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = nObjs;
  if (1 < vEdges->nSize) {
    iVar6 = pVVar4->nSize;
    lVar7 = 1;
    Entry = 0;
    do {
      uVar1 = vEdges->pArray[lVar7 + -1];
      uVar2 = vEdges->pArray[lVar7];
      if (iVar6 <= (int)uVar1) {
        iVar9 = uVar1 + 1;
        iVar8 = iVar6 * 2;
        if (iVar6 * 2 <= iVar9) {
          iVar8 = iVar9;
        }
        iVar3 = pVVar4->nCap;
        iVar6 = iVar9;
        if (iVar3 < iVar8) {
          if (pVVar4->pArray == (Vec_Int_t *)0x0) {
            pVVar5 = (Vec_Int_t *)malloc((long)iVar8 << 4);
          }
          else {
            pVVar5 = (Vec_Int_t *)realloc(pVVar4->pArray,(long)iVar8 << 4);
          }
          pVVar4->pArray = pVVar5;
          memset(pVVar5 + iVar3,0,(long)(iVar8 - iVar3) << 4);
          pVVar4->nCap = iVar8;
        }
      }
      if (((int)uVar1 < 0) || (iVar6 <= (int)uVar1)) {
        pVVar4->nSize = iVar6;
LAB_00749910:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar5 = pVVar4->pArray;
      Vec_IntPush(pVVar5 + uVar1,Entry);
      if (iVar6 <= (int)uVar2) {
        iVar9 = uVar2 + 1;
        iVar8 = iVar6 * 2;
        if (iVar6 * 2 <= iVar9) {
          iVar8 = iVar9;
        }
        iVar3 = pVVar4->nCap;
        iVar6 = iVar9;
        if (iVar3 < iVar8) {
          if (pVVar5 == (Vec_Int_t *)0x0) {
            pVVar5 = (Vec_Int_t *)malloc((long)iVar8 << 4);
          }
          else {
            pVVar5 = (Vec_Int_t *)realloc(pVVar5,(long)iVar8 << 4);
          }
          pVVar4->pArray = pVVar5;
          memset(pVVar5 + iVar3,0,(long)(iVar8 - iVar3) << 4);
          pVVar4->nCap = iVar8;
        }
      }
      if (((int)uVar2 < 0) || (iVar6 <= (int)uVar2)) {
        pVVar4->nSize = iVar6;
        goto LAB_00749910;
      }
      Vec_IntPush(pVVar4->pArray + uVar2,Entry);
      lVar7 = lVar7 + 2;
      Entry = Entry + 1;
    } while ((int)lVar7 < vEdges->nSize);
    pVVar4->nSize = iVar6;
  }
  return pVVar4;
}

Assistant:

Vec_Wec_t * Seg_ManCollectObjEdges( Vec_Int_t * vEdges, int nObjs )
{
    int iFanin, iObj, i;
    Vec_Wec_t * vRes = Vec_WecStart( nObjs );
    Vec_IntForEachEntryDouble( vEdges, iFanin, iObj, i )
    {
        Vec_WecPush( vRes, iFanin, i/2 );
        Vec_WecPush( vRes, iObj, i/2 );
    }
    return vRes;
}